

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attr_wrapper.hpp
# Opt level: O2

Type_error *
attr_wrapper::genTypeError(Type_error *__return_storage_ptr__,string *name,string *type)

{
  string toReturn;
  string local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  std::__cxx11::string::string((string *)&local_50,(string *)name);
  std::operator+(&local_30," is not a",type);
  std::__cxx11::string::append((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_30);
  Type_error::runtime_error(__return_storage_ptr__,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  return __return_storage_ptr__;
}

Assistant:

inline Type_error genTypeError(const std::string& name,
                                  const std::string& type)
   {
      std::string toReturn = name;
      toReturn += " is not a" + type;
      return Type_error(toReturn);
   }